

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::df_solver_t::clear(df_solver_t *this)

{
  uint local_18;
  uint local_14;
  clock_id_t y;
  clock_id_t x;
  df_solver_t *this_local;
  
  for (local_14 = 0; (ulong)local_14 < this->_dim; local_14 = local_14 + 1) {
    for (local_18 = 0; (ulong)local_18 < this->_dim; local_18 = local_18 + 1) {
      this->_L[(ulong)local_14 * this->_dim + (ulong)local_18] = (db_t)0x7ffffffe;
      this->_U[(ulong)local_14 * this->_dim + (ulong)local_18] = (db_t)0x7ffffffe;
    }
    this->_L[(ulong)local_14 * this->_dim + (ulong)local_14] = (db_t)0x1;
    this->_U[(ulong)local_14 * this->_dim + (ulong)local_14] = (db_t)0x1;
  }
  this->_updated_L = false;
  this->_updated_U = false;
  return;
}

Assistant:

void df_solver_t::clear()
{
  // <inf everywhere except <=0 on diagonal
  for (tchecker::clock_id_t x = 0; x < _dim; ++x) {
    for (tchecker::clock_id_t y = 0; y < _dim; ++y) {
      _L[x * _dim + y] = tchecker::dbm::LT_INFINITY;
      _U[x * _dim + y] = tchecker::dbm::LT_INFINITY;
    }
    _L[x * _dim + x] = tchecker::dbm::LE_ZERO;
    _U[x * _dim + x] = tchecker::dbm::LE_ZERO;
  }

  _updated_L = false;
  _updated_U = false;
}